

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O3

void __thiscall Epoll::epoll_add(Epoll *this,SP_Channel *request,int timeout)

{
  int iVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  bool bVar7;
  epoll_event event;
  shared_ptr<Channel> local_50;
  __uint32_t local_3c;
  int local_38;
  
  iVar3 = Channel::getFd((request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (timeout < 1) goto LAB_00104f0e;
  local_50.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_50.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_50.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_50.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_50.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  add_time(this,&local_50,timeout);
  if (local_50.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  peVar2 = (request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var5 = (peVar2->holder_).super___weak_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00104edc:
    peVar6 = (element_type *)0x0;
  }
  else {
    iVar4 = p_Var5->_M_use_count;
    peVar6 = (element_type *)0x0;
    do {
      if (iVar4 == 0) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_00104ee2;
      }
      LOCK();
      iVar1 = p_Var5->_M_use_count;
      bVar7 = iVar4 == iVar1;
      if (bVar7) {
        p_Var5->_M_use_count = iVar4 + 1;
        iVar1 = iVar4;
      }
      iVar4 = iVar1;
      UNLOCK();
    } while (!bVar7);
    if (p_Var5->_M_use_count == 0) goto LAB_00104edc;
    peVar6 = (peVar2->holder_).super___weak_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
LAB_00104ee2:
  this->fd2http_[iVar3].super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  this_00 = this->fd2http_[iVar3].super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  this->fd2http_[iVar3].super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_00104f0e:
  peVar2 = (request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_3c = peVar2->events_;
  peVar2->lastEvents_ = local_3c;
  this->fd2chan_[iVar3].super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  local_38 = iVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&this->fd2chan_[iVar3].super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  iVar3 = epoll_ctl(this->epollFd_,1,iVar3,(epoll_event *)&local_3c);
  if (iVar3 < 0) {
    epoll_add();
  }
  return;
}

Assistant:

void Epoll::epoll_add(SP_Channel request, int timeout){
    int fd = request->getFd();
    if(timeout>0){
        add_time(request, timeout);
        fd2http_[fd] = request->getHolder();
    }
    struct epoll_event event;
    event.data.fd=fd;
    event.events=request->getEvents();

    request->EqualAndUpdateLastEvents();

    fd2chan_[fd] = request;
    if(epoll_ctl(epollFd_, EPOLL_CTL_ADD, fd, &event)<0){
        perror("epoll_add error");
        fd2chan_[fd].reset();
    }
}